

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaTargetGenerator::WriteTargetDependInfo
          (cmNinjaTargetGenerator *this,string *lang,string *config)

{
  cmMakefile *pcVar1;
  cmGeneratorTarget *pcVar2;
  cmTarget *this_00;
  cmSourceFile *this_01;
  pointer puVar3;
  cmInstallGenerator *pcVar4;
  _Base_ptr p_Var5;
  cmInstallExportGenerator *this_02;
  pointer puVar6;
  cmExportBuildFileGenerator *pcVar7;
  size_type sVar8;
  pointer ppcVar9;
  pointer puVar10;
  bool bVar11;
  __type _Var12;
  uint uVar13;
  Value *pVVar14;
  string *psVar15;
  cmFileSet *this_03;
  mapped_type *ppcVar16;
  cmInstallFileSetGenerator *this_04;
  iterator iVar17;
  Value *pVVar18;
  Value *pVVar19;
  string *psVar20;
  _Rb_tree_node_base *p_Var21;
  cmInstallCxxModuleBmiGenerator *pcVar22;
  cmGlobalNinjaGenerator *pcVar23;
  _Base_ptr p_Var24;
  _Base_ptr p_Var25;
  vector<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
  *pvVar26;
  unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *ig;
  pointer ppcVar27;
  pointer puVar28;
  cmInstallCxxModuleBmiGenerator *this_05;
  pointer pbVar29;
  char *value;
  long lVar30;
  ValueHolder *this_06;
  long lVar31;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *entry;
  pointer cge;
  pointer pbVar32;
  unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *ig_1;
  pointer puVar33;
  string *i;
  pointer pbVar34;
  _Alloc_hider value_00;
  basic_string_view<char,_std::char_traits<char>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  string tdin;
  allocator<char> local_499;
  ValueHolder local_498;
  char *local_490;
  string obj_path;
  Value tdi;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  targets;
  Value fs_dest;
  string export_name;
  string local_368 [32];
  string *local_348;
  _Rb_tree_node_base *local_340;
  string mod_dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  fileEntries;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  all_file_sets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directories;
  cmGeneratedFileStream tdif;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  directoryEntries;
  
  Json::Value::Value(&tdi,objectValue);
  Json::Value::Value((Value *)&tdif,lang);
  pVVar14 = Json::Value::operator[](&tdi,"language");
  Json::Value::operator=(pVVar14,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
  tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)&DAT_00000006;
  tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
       (long)"The CMAKE_" + 4;
  tdin._M_string_length = (size_type)(lang->_M_dataplus)._M_p;
  tdin._M_dataplus._M_p = (pointer)lang->_M_string_length;
  cmStrCat<char[13]>(&obj_path,(cmAlphaNum *)&tdif,(cmAlphaNum *)&tdin,(char (*) [13])0x58853b);
  psVar15 = cmMakefile::GetSafeDefinition(pcVar1,&obj_path);
  Json::Value::Value((Value *)&local_498,psVar15);
  pVVar14 = Json::Value::operator[](&tdi,"compiler-id");
  Json::Value::operator=(pVVar14,(Value *)&local_498);
  Json::Value::~Value((Value *)&local_498);
  std::__cxx11::string::~string((string *)&obj_path);
  mod_dir._M_dataplus._M_p = (pointer)&mod_dir.field_2;
  mod_dir._M_string_length = 0;
  mod_dir.field_2._M_local_buf[0] = '\0';
  bVar11 = std::operator==(lang,"Fortran");
  if (bVar11) {
    pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    psVar15 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_
                        ((this->super_cmCommonTargetGenerator).Makefile);
    cmGeneratorTarget::GetFortranModuleDirectory((string *)&tdif,pcVar2,psVar15);
    psVar15 = (string *)&tdif;
    std::__cxx11::string::operator=((string *)&mod_dir,(string *)psVar15);
  }
  else {
    bVar11 = std::operator==(lang,"CXX");
    if (!bVar11) goto LAB_00235437;
    pcVar23 = GetGlobalGenerator(this);
    cmsys::SystemTools::CollapseFullPath
              (&tdin,&((this->super_cmCommonTargetGenerator).GeneratorTarget)->ObjectDirectory);
    (*(pcVar23->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x16]
    )(&tdif,pcVar23,&tdin,config);
    std::__cxx11::string::operator=((string *)&mod_dir,(string *)&tdif);
    std::__cxx11::string::~string((string *)&tdif);
    psVar15 = &tdin;
  }
  std::__cxx11::string::~string((string *)psVar15);
LAB_00235437:
  if (mod_dir._M_string_length == 0) {
    cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((this->super_cmCommonTargetGenerator).Makefile)
    ;
    std::__cxx11::string::_M_assign((string *)&mod_dir);
  }
  Json::Value::Value((Value *)&tdif,&mod_dir);
  pVVar14 = Json::Value::operator[](&tdi,"module-dir");
  Json::Value::operator=(pVVar14,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  bVar11 = std::operator==(lang,"Fortran");
  if (bVar11) {
    pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&tdin,"CMAKE_Fortran_SUBMODULE_SEP",(allocator<char> *)&local_498.bool_);
    psVar15 = cmMakefile::GetSafeDefinition(pcVar1,&tdin);
    Json::Value::Value((Value *)&tdif,psVar15);
    pVVar14 = Json::Value::operator[](&tdi,"submodule-sep");
    Json::Value::operator=(pVVar14,(Value *)&tdif);
    Json::Value::~Value((Value *)&tdif);
    std::__cxx11::string::~string((string *)&tdin);
    pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&tdin,"CMAKE_Fortran_SUBMODULE_EXT",(allocator<char> *)&local_498.bool_);
    psVar15 = cmMakefile::GetSafeDefinition(pcVar1,&tdin);
    Json::Value::Value((Value *)&tdif,psVar15);
    pVVar14 = Json::Value::operator[](&tdi,"submodule-ext");
    Json::Value::operator=(pVVar14,(Value *)&tdif);
    Json::Value::~Value((Value *)&tdif);
    std::__cxx11::string::~string((string *)&tdin);
  }
  else {
    std::operator==(lang,"CXX");
  }
  psVar15 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                      ((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value((Value *)&tdif,psVar15);
  pVVar14 = Json::Value::operator[](&tdi,"dir-cur-bld");
  Json::Value::operator=(pVVar14,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  psVar15 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                      ((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value((Value *)&tdif,psVar15);
  pVVar14 = Json::Value::operator[](&tdi,"dir-cur-src");
  Json::Value::operator=(pVVar14,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  psVar15 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_
                      ((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value((Value *)&tdif,psVar15);
  pVVar14 = Json::Value::operator[](&tdi,"dir-top-bld");
  Json::Value::operator=(pVVar14,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  psVar15 = cmMakefile::GetHomeDirectory_abi_cxx11_((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value((Value *)&tdif,psVar15);
  pVVar14 = Json::Value::operator[](&tdi,"dir-top-src");
  Json::Value::operator=(pVVar14,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  Json::Value::Value((Value *)&tdif,arrayValue);
  pVVar14 = Json::Value::operator[](&tdi,"include-dirs");
  pVVar14 = Json::Value::operator=(pVVar14,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmLocalGenerator::GetIncludeDirectories
            ((cmLocalGenerator *)this->LocalGenerator,&includes,
             (this->super_cmCommonTargetGenerator).GeneratorTarget,lang,config);
  pbVar29 = includes.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar34 = includes.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar34 != pbVar29;
      pbVar34 = pbVar34 + 1) {
    psVar15 = ConvertToNinjaPath(this,pbVar34);
    Json::Value::Value((Value *)&tdif,psVar15);
    Json::Value::append(pVVar14,(Value *)&tdif);
    Json::Value::~Value((Value *)&tdif);
  }
  Json::Value::Value((Value *)&tdif,arrayValue);
  pVVar14 = Json::Value::operator[](&tdi,"linked-target-dirs");
  pVVar14 = Json::Value::operator=(pVVar14,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  cmCommonTargetGenerator::GetLinkedTargetDirectories
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&tdin,&this->super_cmCommonTargetGenerator,config);
  sVar8 = tdin._M_string_length;
  for (value_00 = tdin._M_dataplus; value_00._M_p != (pointer)sVar8;
      value_00._M_p = value_00._M_p + 0x20) {
    Json::Value::Value((Value *)&tdif,(String *)value_00._M_p);
    Json::Value::append(pVVar14,(Value *)&tdif);
    Json::Value::~Value((Value *)&tdif);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&tdin);
  this_00 = ((this->super_cmCommonTargetGenerator).GeneratorTarget)->Target;
  cmTarget::GetAllFileSetNames_abi_cxx11_(&all_file_sets,this_00);
  Json::Value::Value((Value *)&tdif,objectValue);
  pVVar14 = Json::Value::operator[](&tdi,"cxx-modules");
  pVVar14 = Json::Value::operator=(pVVar14,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  local_348 = all_file_sets.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar29 = all_file_sets.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar29 != local_348;
      pbVar29 = pbVar29 + 1) {
    this_03 = cmTarget::GetFileSet(this_00,pbVar29);
    if (this_03 == (cmFileSet *)0x0) {
      pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
      tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)0x8;
      tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
           (long)"\nTarget \"" + 1;
      psVar15 = cmTarget::GetName_abi_cxx11_(this_00);
      tdin._M_string_length = (size_type)(psVar15->_M_dataplus)._M_p;
      tdin._M_dataplus._M_p = (pointer)psVar15->_M_string_length;
      cmStrCat<char[32],std::__cxx11::string,char[25]>
                ((string *)&local_498,(cmAlphaNum *)&tdif,(cmAlphaNum *)&tdin,
                 (char (*) [32])"\" is tracked to have file set \"",pbVar29,
                 (char (*) [25])"\", but it was not found.");
      cmMakefile::IssueMessage(pcVar1,INTERNAL_ERROR,(string *)&local_498);
      this_06 = &local_498;
    }
    else {
      std::__cxx11::string::string((string *)&export_name,(string *)&this_03->Type);
      __y._M_str = "CXX_MODULES";
      __y._M_len = 0xb;
      __x._M_str = export_name._M_dataplus._M_p;
      __x._M_len = export_name._M_string_length;
      bVar11 = std::operator!=(__x,__y);
      if (!bVar11) {
        cmFileSet::CompileFileEntries(&fileEntries,this_03);
        cmFileSet::CompileDirectoryEntries(&directoryEntries,this_03);
        pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
        cmFileSet::EvaluateDirectoryEntries
                  (&directories,this_03,&directoryEntries,pcVar2->LocalGenerator,config,pcVar2,
                   (cmGeneratorExpressionDAGChecker *)0x0);
        puVar10 = fileEntries.
                  super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
             tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ &
             0xffffffff00000000;
        tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = 0;
        tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ =
             &tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
        tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ = 0;
        tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ =
             tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._24_8_;
        for (cge = fileEntries.
                   super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; cge != puVar10; cge = cge + 1) {
          pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
          cmFileSet::EvaluateFileEntry
                    (this_03,&directories,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      *)&tdif,cge,pcVar2->LocalGenerator,config,pcVar2,
                     (cmGeneratorExpressionDAGChecker *)0x0);
        }
        tdin._M_string_length = tdin._M_string_length & 0xffffffff00000000;
        tdin.field_2._M_allocated_capacity = 0;
        tdin.field_2._8_8_ = &tdin._M_string_length;
        objectSources.
        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._0_16_ = ZEXT816(0);
        objectSources.
        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        cmGeneratorTarget::GetObjectSources
                  ((this->super_cmCommonTargetGenerator).GeneratorTarget,&objectSources,config);
        ppcVar9 = objectSources.
                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (ppcVar27 = objectSources.
                        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppcVar27 != ppcVar9;
            ppcVar27 = ppcVar27 + 1) {
          this_01 = *ppcVar27;
          psVar15 = cmSourceFile::GetFullPath_abi_cxx11_(this_01);
          std::__cxx11::string::string((string *)&fs_dest,(string *)psVar15);
          if (fs_dest._8_8_ == 0) {
            pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
            local_498.int_ = 8;
            local_490 = "Target \"";
            psVar15 = cmTarget::GetName_abi_cxx11_(this_00);
            obj_path._M_string_length = (size_type)(psVar15->_M_dataplus)._M_p;
            obj_path._M_dataplus._M_p = (pointer)psVar15->_M_string_length;
            cmStrCat<char[36]>((string *)&targets,(cmAlphaNum *)&local_498,(cmAlphaNum *)&obj_path,
                               (char (*) [36])"\" has a full path-less source file.");
            cmMakefile::IssueMessage(pcVar1,INTERNAL_ERROR,(string *)&targets);
            std::__cxx11::string::~string((string *)&targets);
          }
          else {
            ppcVar16 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*>_>_>
                                     *)&tdin,(key_type *)&fs_dest);
            *ppcVar16 = this_01;
          }
          std::__cxx11::string::~string((string *)&fs_dest);
        }
        std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::
        ~_Vector_base(&objectSources.
                       super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                     );
        Json::Value::Value(&fs_dest,nullValue);
        pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
        puVar3 = (pcVar1->InstallGenerators).
                 super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (puVar28 = (pcVar1->InstallGenerators).
                       super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            p_Var21 = (_Rb_tree_node_base *)
                      tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._24_8_,
            puVar28 != puVar3; puVar28 = puVar28 + 1) {
          pcVar4 = (puVar28->_M_t).
                   super___uniq_ptr_impl<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>
                   .super__Head_base<0UL,_cmInstallGenerator_*,_false>._M_head_impl;
          if ((((pcVar4 != (cmInstallGenerator *)0x0) &&
               (this_04 = (cmInstallFileSetGenerator *)
                          __dynamic_cast(pcVar4,&cmInstallGenerator::typeinfo,
                                         &cmInstallFileSetGenerator::typeinfo,0),
               this_04 != (cmInstallFileSetGenerator *)0x0)) &&
              (this_04->Target == (this->super_cmCommonTargetGenerator).GeneratorTarget)) &&
             (this_04->FileSet == this_03)) {
            cmInstallFileSetGenerator::GetDestination(&obj_path,this_04,config);
            Json::Value::Value((Value *)&local_498,&obj_path);
            Json::Value::operator=(&fs_dest,(Value *)&local_498);
            Json::Value::~Value((Value *)&local_498);
            std::__cxx11::string::~string((string *)&obj_path);
          }
        }
        while (p_Var21 !=
               (_Rb_tree_node_base *)
               &tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8) {
          p_Var24 = p_Var21[2]._M_parent;
          local_340 = p_Var21;
          for (p_Var25 = *(_Base_ptr *)(p_Var21 + 2); p_Var25 != p_Var24; p_Var25 = p_Var25 + 1) {
            iVar17 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*>_>_>
                             *)&tdin,(key_type *)p_Var25);
            psVar15 = (string *)&targets;
            if (iVar17._M_node == (_Base_ptr)&tdin._M_string_length) {
              pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
              local_498.int_ = 8;
              local_490 = "Target \"";
              psVar20 = cmTarget::GetName_abi_cxx11_(this_00);
              obj_path._M_string_length = (size_type)(psVar20->_M_dataplus)._M_p;
              obj_path._M_dataplus._M_p = (pointer)psVar20->_M_string_length;
              cmStrCat<char[20],std::__cxx11::string,char[51]>
                        ((string *)&targets,(cmAlphaNum *)&local_498,(cmAlphaNum *)&obj_path,
                         (char (*) [20])"\" has source file \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         p_Var25,(char (*) [51])
                                 "\" which is not in any of its \"FILE_SET BASE_DIRS\".");
              cmMakefile::IssueMessage(pcVar1,INTERNAL_ERROR,(string *)&targets);
            }
            else if (*(cmSourceFile **)(iVar17._M_node + 2) == (cmSourceFile *)0x0) {
              pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
              local_498.int_ = 8;
              local_490 = "Target \"";
              psVar20 = cmTarget::GetName_abi_cxx11_(this_00);
              obj_path._M_string_length = (size_type)(psVar20->_M_dataplus)._M_p;
              obj_path._M_dataplus._M_p = (pointer)psVar20->_M_string_length;
              cmStrCat<char[20],std::__cxx11::string,char[39]>
                        ((string *)&targets,(cmAlphaNum *)&local_498,(cmAlphaNum *)&obj_path,
                         (char (*) [20])"\" has source file \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         p_Var25,(char (*) [39])"\" which has not been tracked properly.");
              cmMakefile::IssueMessage(pcVar1,INTERNAL_ERROR,(string *)&targets);
            }
            else {
              GetObjectFilePath(&obj_path,this,*(cmSourceFile **)(iVar17._M_node + 2),config);
              Json::Value::Value((Value *)&local_498,objectValue);
              pVVar18 = Json::Value::operator[](pVVar14,&obj_path);
              pVVar18 = Json::Value::operator=(pVVar18,(Value *)&local_498);
              Json::Value::~Value((Value *)&local_498);
              Json::Value::Value((Value *)&local_498,(String *)p_Var25);
              pVVar19 = Json::Value::operator[](pVVar18,"source");
              Json::Value::operator=(pVVar19,(Value *)&local_498);
              Json::Value::~Value((Value *)&local_498);
              Json::Value::Value((Value *)&local_498,(String *)(p_Var21 + 1));
              pVVar19 = Json::Value::operator[](pVVar18,"relative-directory");
              Json::Value::operator=(pVVar19,(Value *)&local_498);
              Json::Value::~Value((Value *)&local_498);
              Json::Value::Value((Value *)&local_498,&this_03->Name);
              pVVar19 = Json::Value::operator[](pVVar18,"name");
              Json::Value::operator=(pVVar19,(Value *)&local_498);
              Json::Value::~Value((Value *)&local_498);
              Json::Value::Value((Value *)&local_498,&this_03->Type);
              pVVar19 = Json::Value::operator[](pVVar18,"type");
              Json::Value::operator=(pVVar19,(Value *)&local_498);
              Json::Value::~Value((Value *)&local_498);
              objectSources.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._0_16_ =
                   cmFileSetVisibilityToName(this_03->Visibility);
              std::__cxx11::string::string<cm::static_string_view,void>
                        ((string *)&targets,(static_string_view *)&objectSources,&local_499);
              Json::Value::Value((Value *)&local_498,(string *)&targets);
              pVVar19 = Json::Value::operator[](pVVar18,"visibility");
              Json::Value::operator=(pVVar19,(Value *)&local_498);
              Json::Value::~Value((Value *)&local_498);
              std::__cxx11::string::~string((string *)&targets);
              pVVar18 = Json::Value::operator[](pVVar18,"destination");
              Json::Value::operator=(pVVar18,&fs_dest);
              psVar15 = &obj_path;
            }
            std::__cxx11::string::~string((string *)psVar15);
          }
          p_Var21 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_340);
        }
        Json::Value::~Value(&fs_dest);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*>_>_>
                     *)&tdin);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     *)&tdif);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&directories);
        std::
        vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
        ::~vector(&directoryEntries);
        std::
        vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
        ::~vector(&fileEntries);
      }
      this_06 = (ValueHolder *)&export_name;
    }
    std::__cxx11::string::~string((string *)&this_06->bool_);
  }
  Json::Value::Value((Value *)&tdif,config);
  pVVar14 = Json::Value::operator[](&tdi,"config");
  Json::Value::operator=(pVVar14,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  Json::Value::Value((Value *)&tdif,arrayValue);
  pVVar14 = Json::Value::operator[](&tdi,"exports");
  pVVar14 = Json::Value::operator=(pVVar14,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  cmGeneratorTarget::GetExportName_abi_cxx11_
            (&export_name,(this->super_cmCommonTargetGenerator).GeneratorTarget);
  pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
  puVar3 = (pcVar1->InstallGenerators).
           super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_05 = (cmInstallCxxModuleBmiGenerator *)0x0;
  for (puVar28 = (pcVar1->InstallGenerators).
                 super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar28 != puVar3; puVar28 = puVar28 + 1
      ) {
    pcVar4 = (puVar28->_M_t).
             super___uniq_ptr_impl<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>.
             _M_t.
             super__Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>.
             super__Head_base<0UL,_cmInstallGenerator_*,_false>._M_head_impl;
    if (((pcVar4 == (cmInstallGenerator *)0x0) ||
        (pcVar22 = (cmInstallCxxModuleBmiGenerator *)
                   __dynamic_cast(pcVar4,&cmInstallGenerator::typeinfo,
                                  &cmInstallCxxModuleBmiGenerator::typeinfo,0),
        pcVar22 == (cmInstallCxxModuleBmiGenerator *)0x0)) || (pcVar22->Target != pcVar2)) {
      pcVar22 = this_05;
    }
    this_05 = pcVar22;
  }
  if (this_05 == (cmInstallCxxModuleBmiGenerator *)0x0) {
    Json::Value::Value((Value *)&tdif,nullValue);
    pVVar18 = Json::Value::operator[](&tdi,"bmi-installation");
    Json::Value::operator=(pVVar18,(Value *)&tdif);
  }
  else {
    Json::Value::Value((Value *)&tdif,objectValue);
    Json::Value::Value((Value *)&tdin,&this_05->FilePermissions);
    pVVar18 = Json::Value::operator[]((Value *)&tdif,"permissions");
    Json::Value::operator=(pVVar18,(Value *)&tdin);
    Json::Value::~Value((Value *)&tdin);
    cmInstallCxxModuleBmiGenerator::GetDestination((string *)&local_498,this_05,config);
    Json::Value::Value((Value *)&tdin,(String *)&local_498);
    pVVar18 = Json::Value::operator[]((Value *)&tdif,"destination");
    Json::Value::operator=(pVVar18,(Value *)&tdin);
    Json::Value::~Value((Value *)&tdin);
    std::__cxx11::string::~string((string *)&local_498.bool_);
    uVar13 = (this_05->super_cmInstallGenerator).Message - MessageAlways;
    if (uVar13 < 3) {
      value = &DAT_00587e34 + *(int *)(&DAT_00587e34 + (ulong)uVar13 * 4);
    }
    else {
      value = "";
    }
    Json::Value::Value((Value *)&tdin,value);
    pVVar18 = Json::Value::operator[]((Value *)&tdif,"message-level");
    Json::Value::operator=(pVVar18,(Value *)&tdin);
    Json::Value::~Value((Value *)&tdin);
    cmInstallCxxModuleBmiGenerator::GetScriptLocation((string *)&local_498,this_05,config);
    Json::Value::Value((Value *)&tdin,(String *)&local_498);
    pVVar18 = Json::Value::operator[]((Value *)&tdif,"script-location");
    Json::Value::operator=(pVVar18,(Value *)&tdin);
    Json::Value::~Value((Value *)&tdin);
    std::__cxx11::string::~string((string *)&local_498.bool_);
    pVVar18 = Json::Value::operator[](&tdi,"bmi-installation");
    Json::Value::operator=(pVVar18,(Value *)&tdif);
  }
  Json::Value::~Value((Value *)&tdif);
  pcVar23 = GetGlobalGenerator(this);
  for (p_Var25 = (pcVar23->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.ExportSets.
                 super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
                 ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var25 !=
      &(pcVar23->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.ExportSets.
       super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
       ._M_t._M_impl.super__Rb_tree_header; p_Var25 = (_Base_ptr)std::_Rb_tree_increment(p_Var25)) {
    p_Var24 = *(_Base_ptr *)(p_Var25 + 2);
    p_Var5 = p_Var25[2]._M_parent;
    lVar30 = (long)p_Var5 - (long)p_Var24;
    pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    for (lVar31 = lVar30 >> 5; 0 < lVar31; lVar31 = lVar31 + -1) {
      if (*(cmGeneratorTarget **)(*(long *)p_Var24 + 0x20) == pcVar2) goto LAB_0023637f;
      if (*(cmGeneratorTarget **)(p_Var24->_M_parent + 1) == pcVar2) {
        p_Var24 = (_Base_ptr)&p_Var24->_M_parent;
        goto LAB_0023637f;
      }
      if (*(cmGeneratorTarget **)(p_Var24->_M_left + 1) == pcVar2) {
        p_Var24 = (_Base_ptr)&p_Var24->_M_left;
        goto LAB_0023637f;
      }
      if (*(cmGeneratorTarget **)(p_Var24->_M_right + 1) == pcVar2) {
        p_Var24 = (_Base_ptr)&p_Var24->_M_right;
        goto LAB_0023637f;
      }
      p_Var24 = p_Var24 + 1;
      lVar30 = lVar30 + -0x20;
    }
    lVar30 = lVar30 >> 3;
    if (lVar30 == 1) {
LAB_00236362:
      if (*(cmGeneratorTarget **)(*(long *)p_Var24 + 0x20) != pcVar2) {
        p_Var24 = p_Var5;
      }
LAB_0023637f:
      if (p_Var24 != p_Var5) {
        p_Var5 = *(_Base_ptr *)(p_Var25 + 4);
        for (p_Var24 = p_Var25[3]._M_right; p_Var24 != p_Var5;
            p_Var24 = (_Base_ptr)&p_Var24->_M_parent) {
          this_02 = *(cmInstallExportGenerator **)p_Var24;
          Json::Value::Value((Value *)&tdif,objectValue);
          std::__cxx11::string::string
                    ((string *)&local_498.bool_,(string *)&this_02->CxxModulesDirectory);
          cmInstallExportGenerator::GetTempDir_abi_cxx11_(&obj_path,this_02);
          Json::Value::Value((Value *)&tdin,&this_02->Namespace);
          pVVar18 = Json::Value::operator[]((Value *)&tdif,"namespace");
          Json::Value::operator=(pVVar18,(Value *)&tdin);
          Json::Value::~Value((Value *)&tdin);
          Json::Value::Value((Value *)&tdin,&export_name);
          pVVar18 = Json::Value::operator[]((Value *)&tdif,"export-name");
          Json::Value::operator=(pVVar18,(Value *)&tdin);
          Json::Value::~Value((Value *)&tdin);
          Json::Value::Value((Value *)&tdin,&(this_02->super_cmInstallGenerator).Destination);
          pVVar18 = Json::Value::operator[]((Value *)&tdif,"destination");
          Json::Value::operator=(pVVar18,(Value *)&tdin);
          Json::Value::~Value((Value *)&tdin);
          Json::Value::Value((Value *)&tdin,(String *)&local_498);
          pVVar18 = Json::Value::operator[]((Value *)&tdif,"cxx-module-info-dir");
          Json::Value::operator=(pVVar18,(Value *)&tdin);
          Json::Value::~Value((Value *)&tdin);
          Json::Value::Value((Value *)&tdin,&obj_path);
          pVVar18 = Json::Value::operator[]((Value *)&tdif,"export-prefix");
          Json::Value::operator=(pVVar18,(Value *)&tdin);
          Json::Value::~Value((Value *)&tdin);
          Json::Value::Value((Value *)&tdin,true);
          pVVar18 = Json::Value::operator[]((Value *)&tdif,"install");
          Json::Value::operator=(pVVar18,(Value *)&tdin);
          Json::Value::~Value((Value *)&tdin);
          Json::Value::append(pVVar14,(Value *)&tdif);
          std::__cxx11::string::~string((string *)&obj_path);
          std::__cxx11::string::~string((string *)&local_498.bool_);
          Json::Value::~Value((Value *)&tdif);
        }
      }
    }
    else {
      if (lVar30 == 2) {
LAB_00236355:
        if (*(cmGeneratorTarget **)(*(long *)p_Var24 + 0x20) != pcVar2) {
          p_Var24 = (_Base_ptr)&p_Var24->_M_parent;
          goto LAB_00236362;
        }
        goto LAB_0023637f;
      }
      if (lVar30 == 3) {
        if (*(cmGeneratorTarget **)(*(long *)p_Var24 + 0x20) != pcVar2) {
          p_Var24 = (_Base_ptr)&p_Var24->_M_parent;
          goto LAB_00236355;
        }
        goto LAB_0023637f;
      }
    }
  }
  pvVar26 = cmMakefile::GetExportBuildFileGenerators((this->super_cmCommonTargetGenerator).Makefile)
  ;
  puVar33 = (pvVar26->
            super__Vector_base<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  puVar6 = (pvVar26->
           super__Vector_base<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar33 == puVar6) {
      GetTargetDependInfoPath(&tdin,this,lang,config);
      cmGeneratedFileStream::cmGeneratedFileStream(&tdif,&tdin,false,None);
      Json::operator<<((OStream *)&tdif,&tdi);
      cmGeneratedFileStream::~cmGeneratedFileStream(&tdif);
      std::__cxx11::string::~string((string *)&tdin);
      std::__cxx11::string::~string((string *)&export_name);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&all_file_sets);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&includes);
      std::__cxx11::string::~string((string *)&mod_dir);
      Json::Value::~Value(&tdi);
      return;
    }
    targets.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    targets.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    targets.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmExportBuildFileGenerator::GetTargets
              ((puVar33->_M_t).
               super___uniq_ptr_impl<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmExportBuildFileGenerator_*,_std::default_delete<cmExportBuildFileGenerator>_>
               .super__Head_base<0UL,_cmExportBuildFileGenerator_*,_false>._M_head_impl,&targets);
    psVar15 = cmGeneratorTarget::GetName_abi_cxx11_
                        ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    pbVar34 = targets.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pbVar29 = targets.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::string(local_368,(string *)psVar15);
    std::__cxx11::string::string((string *)&fs_dest,local_368);
    std::__cxx11::string::string((string *)&obj_path,(string *)&fs_dest);
    std::__cxx11::string::string((string *)&local_498.bool_,(string *)&obj_path);
    std::__cxx11::string::string((string *)&tdif,(string *)&local_498.bool_);
    std::__cxx11::string::string((string *)&tdin,(string *)&tdif);
    std::__cxx11::string::~string((string *)&tdif);
    std::__cxx11::string::string((string *)&tdif,(string *)&tdin);
    lVar31 = (long)pbVar34 - (long)pbVar29;
    for (lVar30 = lVar31 >> 7; 0 < lVar30; lVar30 = lVar30 + -1) {
      _Var12 = std::operator==(pbVar29,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&tdif);
      pbVar32 = pbVar29;
      if (_Var12) goto LAB_00236721;
      _Var12 = std::operator==(pbVar29 + 1,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &tdif);
      pbVar32 = pbVar29 + 1;
      if (_Var12) goto LAB_00236721;
      _Var12 = std::operator==(pbVar29 + 2,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &tdif);
      pbVar32 = pbVar29 + 2;
      if (_Var12) goto LAB_00236721;
      _Var12 = std::operator==(pbVar29 + 3,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &tdif);
      pbVar32 = pbVar29 + 3;
      if (_Var12) goto LAB_00236721;
      pbVar29 = pbVar29 + 4;
      lVar31 = lVar31 + -0x80;
    }
    lVar31 = lVar31 >> 5;
    if (lVar31 == 1) {
LAB_00236994:
      _Var12 = std::operator==(pbVar29,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&tdif);
      pbVar32 = pbVar29;
      if (!_Var12) {
        pbVar32 = pbVar34;
      }
    }
    else if (lVar31 == 2) {
LAB_0023696a:
      _Var12 = std::operator==(pbVar29,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&tdif);
      pbVar32 = pbVar29;
      if (!_Var12) {
        pbVar29 = pbVar29 + 1;
        goto LAB_00236994;
      }
    }
    else {
      pbVar32 = pbVar34;
      if ((lVar31 == 3) &&
         (_Var12 = std::operator==(pbVar29,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&tdif), pbVar32 = pbVar29, !_Var12)) {
        pbVar29 = pbVar29 + 1;
        goto LAB_0023696a;
      }
    }
LAB_00236721:
    std::__cxx11::string::~string((string *)&tdif);
    std::__cxx11::string::~string((string *)&tdin);
    std::__cxx11::string::~string((string *)&local_498.bool_);
    std::__cxx11::string::~string((string *)&obj_path);
    std::__cxx11::string::~string((string *)&fs_dest);
    std::__cxx11::string::~string(local_368);
    if (pbVar32 != pbVar34) {
      Json::Value::Value((Value *)&tdif,objectValue);
      std::__cxx11::string::string
                ((string *)&local_498.bool_,
                 (string *)
                 &(((puVar33->_M_t).
                    super___uniq_ptr_impl<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmExportBuildFileGenerator_*,_std::default_delete<cmExportBuildFileGenerator>_>
                    .super__Head_base<0UL,_cmExportBuildFileGenerator_*,_false>._M_head_impl)->
                  super_cmExportFileGenerator).Namespace);
      psVar15 = cmExportFileGenerator::GetMainExportFileName_abi_cxx11_
                          (&((puVar33->_M_t).
                             super___uniq_ptr_impl<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmExportBuildFileGenerator_*,_std::default_delete<cmExportBuildFileGenerator>_>
                             .super__Head_base<0UL,_cmExportBuildFileGenerator_*,_false>.
                            _M_head_impl)->super_cmExportFileGenerator);
      pcVar7 = (puVar33->_M_t).
               super___uniq_ptr_impl<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmExportBuildFileGenerator_*,_std::default_delete<cmExportBuildFileGenerator>_>
               .super__Head_base<0UL,_cmExportBuildFileGenerator_*,_false>._M_head_impl;
      cmsys::SystemTools::GetParentDirectory(&obj_path,psVar15);
      psVar15 = cmExportFileGenerator::GetMainExportFileName_abi_cxx11_
                          (&((puVar33->_M_t).
                             super___uniq_ptr_impl<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmExportBuildFileGenerator_*,_std::default_delete<cmExportBuildFileGenerator>_>
                             .super__Head_base<0UL,_cmExportBuildFileGenerator_*,_false>.
                            _M_head_impl)->super_cmExportFileGenerator);
      cmsys::SystemTools::GetFilenamePath((string *)&fs_dest,psVar15);
      Json::Value::Value((Value *)&tdin,(String *)&local_498);
      pVVar18 = Json::Value::operator[]((Value *)&tdif,"namespace");
      Json::Value::operator=(pVVar18,(Value *)&tdin);
      Json::Value::~Value((Value *)&tdin);
      Json::Value::Value((Value *)&tdin,&export_name);
      pVVar18 = Json::Value::operator[]((Value *)&tdif,"export-name");
      Json::Value::operator=(pVVar18,(Value *)&tdin);
      Json::Value::~Value((Value *)&tdin);
      Json::Value::Value((Value *)&tdin,&obj_path);
      pVVar18 = Json::Value::operator[]((Value *)&tdif,"destination");
      Json::Value::operator=(pVVar18,(Value *)&tdin);
      Json::Value::~Value((Value *)&tdin);
      Json::Value::Value((Value *)&tdin,&pcVar7->CxxModulesDirectory);
      pVVar18 = Json::Value::operator[]((Value *)&tdif,"cxx-module-info-dir");
      Json::Value::operator=(pVVar18,(Value *)&tdin);
      Json::Value::~Value((Value *)&tdin);
      Json::Value::Value((Value *)&tdin,(String *)&fs_dest);
      pVVar18 = Json::Value::operator[]((Value *)&tdif,"export-prefix");
      Json::Value::operator=(pVVar18,(Value *)&tdin);
      Json::Value::~Value((Value *)&tdin);
      Json::Value::Value((Value *)&tdin,false);
      pVVar18 = Json::Value::operator[]((Value *)&tdif,"install");
      Json::Value::operator=(pVVar18,(Value *)&tdin);
      Json::Value::~Value((Value *)&tdin);
      Json::Value::append(pVVar14,(Value *)&tdif);
      std::__cxx11::string::~string((string *)&fs_dest);
      std::__cxx11::string::~string((string *)&obj_path);
      std::__cxx11::string::~string((string *)&local_498.bool_);
      Json::Value::~Value((Value *)&tdif);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&targets);
    puVar33 = puVar33 + 1;
  } while( true );
}

Assistant:

void cmNinjaTargetGenerator::WriteTargetDependInfo(std::string const& lang,
                                                   const std::string& config)
{
  Json::Value tdi(Json::objectValue);
  tdi["language"] = lang;
  tdi["compiler-id"] = this->Makefile->GetSafeDefinition(
    cmStrCat("CMAKE_", lang, "_COMPILER_ID"));

  std::string mod_dir;
  if (lang == "Fortran") {
    mod_dir = this->GeneratorTarget->GetFortranModuleDirectory(
      this->Makefile->GetHomeOutputDirectory());
  } else if (lang == "CXX") {
    mod_dir = this->GetGlobalGenerator()->ExpandCFGIntDir(
      cmSystemTools::CollapseFullPath(this->GeneratorTarget->ObjectDirectory),
      config);
  }
  if (mod_dir.empty()) {
    mod_dir = this->Makefile->GetCurrentBinaryDirectory();
  }
  tdi["module-dir"] = mod_dir;

  if (lang == "Fortran") {
    tdi["submodule-sep"] =
      this->Makefile->GetSafeDefinition("CMAKE_Fortran_SUBMODULE_SEP");
    tdi["submodule-ext"] =
      this->Makefile->GetSafeDefinition("CMAKE_Fortran_SUBMODULE_EXT");
  } else if (lang == "CXX") {
    // No extra information necessary.
  }

  tdi["dir-cur-bld"] = this->Makefile->GetCurrentBinaryDirectory();
  tdi["dir-cur-src"] = this->Makefile->GetCurrentSourceDirectory();
  tdi["dir-top-bld"] = this->Makefile->GetHomeOutputDirectory();
  tdi["dir-top-src"] = this->Makefile->GetHomeDirectory();

  Json::Value& tdi_include_dirs = tdi["include-dirs"] = Json::arrayValue;
  std::vector<std::string> includes;
  this->LocalGenerator->GetIncludeDirectories(includes, this->GeneratorTarget,
                                              lang, config);
  for (std::string const& i : includes) {
    // Convert the include directories the same way we do for -I flags.
    // See upstream ninja issue 1251.
    tdi_include_dirs.append(this->ConvertToNinjaPath(i));
  }

  Json::Value& tdi_linked_target_dirs = tdi["linked-target-dirs"] =
    Json::arrayValue;
  for (std::string const& l : this->GetLinkedTargetDirectories(config)) {
    tdi_linked_target_dirs.append(l);
  }

  cmTarget* tgt = this->GeneratorTarget->Target;
  auto all_file_sets = tgt->GetAllFileSetNames();
  Json::Value& tdi_cxx_module_info = tdi["cxx-modules"] = Json::objectValue;
  for (auto const& file_set_name : all_file_sets) {
    auto* file_set = tgt->GetFileSet(file_set_name);
    if (!file_set) {
      this->GetMakefile()->IssueMessage(
        MessageType::INTERNAL_ERROR,
        cmStrCat("Target \"", tgt->GetName(),
                 "\" is tracked to have file set \"", file_set_name,
                 "\", but it was not found."));
      continue;
    }
    auto fs_type = file_set->GetType();
    // We only care about C++ module sources here.
    if (fs_type != "CXX_MODULES"_s) {
      continue;
    }

    auto fileEntries = file_set->CompileFileEntries();
    auto directoryEntries = file_set->CompileDirectoryEntries();

    auto directories = file_set->EvaluateDirectoryEntries(
      directoryEntries, this->GeneratorTarget->LocalGenerator, config,
      this->GeneratorTarget);
    std::map<std::string, std::vector<std::string>> files_per_dirs;
    for (auto const& entry : fileEntries) {
      file_set->EvaluateFileEntry(directories, files_per_dirs, entry,
                                  this->GeneratorTarget->LocalGenerator,
                                  config, this->GeneratorTarget);
    }

    std::map<std::string, cmSourceFile const*> sf_map;
    {
      std::vector<cmSourceFile const*> objectSources;
      this->GeneratorTarget->GetObjectSources(objectSources, config);
      for (auto const* sf : objectSources) {
        auto full_path = sf->GetFullPath();
        if (full_path.empty()) {
          this->GetMakefile()->IssueMessage(
            MessageType::INTERNAL_ERROR,
            cmStrCat("Target \"", tgt->GetName(),
                     "\" has a full path-less source file."));
          continue;
        }
        sf_map[full_path] = sf;
      }
    }

    Json::Value fs_dest = Json::nullValue;
    for (auto const& ig : this->GetMakefile()->GetInstallGenerators()) {
      if (auto const* fsg =
            dynamic_cast<cmInstallFileSetGenerator const*>(ig.get())) {
        if (fsg->GetTarget() == this->GeneratorTarget &&
            fsg->GetFileSet() == file_set) {
          fs_dest = fsg->GetDestination(config);
          continue;
        }
      }
    }

    for (auto const& files_per_dir : files_per_dirs) {
      for (auto const& file : files_per_dir.second) {
        auto lookup = sf_map.find(file);
        if (lookup == sf_map.end()) {
          this->GetMakefile()->IssueMessage(
            MessageType::INTERNAL_ERROR,
            cmStrCat("Target \"", tgt->GetName(), "\" has source file \"",
                     file,
                     R"(" which is not in any of its "FILE_SET BASE_DIRS".)"));
          continue;
        }

        auto const* sf = lookup->second;

        if (!sf) {
          this->GetMakefile()->IssueMessage(
            MessageType::INTERNAL_ERROR,
            cmStrCat("Target \"", tgt->GetName(), "\" has source file \"",
                     file, "\" which has not been tracked properly."));
          continue;
        }

        auto obj_path = this->GetObjectFilePath(sf, config);
        Json::Value& tdi_module_info = tdi_cxx_module_info[obj_path] =
          Json::objectValue;

        tdi_module_info["source"] = file;
        tdi_module_info["relative-directory"] = files_per_dir.first;
        tdi_module_info["name"] = file_set->GetName();
        tdi_module_info["type"] = file_set->GetType();
        tdi_module_info["visibility"] =
          std::string(cmFileSetVisibilityToName(file_set->GetVisibility()));
        tdi_module_info["destination"] = fs_dest;
      }
    }
  }

  tdi["config"] = config;

  // Add information about the export sets that this target is a member of.
  Json::Value& tdi_exports = tdi["exports"] = Json::arrayValue;
  std::string export_name = this->GeneratorTarget->GetExportName();

  cmInstallCxxModuleBmiGenerator const* bmi_gen = nullptr;
  for (auto const& ig : this->GetMakefile()->GetInstallGenerators()) {
    if (auto const* bmig =
          dynamic_cast<cmInstallCxxModuleBmiGenerator const*>(ig.get())) {
      if (bmig->GetTarget() == this->GeneratorTarget) {
        bmi_gen = bmig;
        continue;
      }
    }
  }
  if (bmi_gen) {
    Json::Value tdi_bmi_info = Json::objectValue;

    tdi_bmi_info["permissions"] = bmi_gen->GetFilePermissions();
    tdi_bmi_info["destination"] = bmi_gen->GetDestination(config);
    const char* msg_level = "";
    switch (bmi_gen->GetMessageLevel()) {
      case cmInstallGenerator::MessageDefault:
        break;
      case cmInstallGenerator::MessageAlways:
        msg_level = "MESSAGE_ALWAYS";
        break;
      case cmInstallGenerator::MessageLazy:
        msg_level = "MESSAGE_LAZY";
        break;
      case cmInstallGenerator::MessageNever:
        msg_level = "MESSAGE_NEVER";
        break;
    }
    tdi_bmi_info["message-level"] = msg_level;
    tdi_bmi_info["script-location"] = bmi_gen->GetScriptLocation(config);

    tdi["bmi-installation"] = tdi_bmi_info;
  } else {
    tdi["bmi-installation"] = Json::nullValue;
  }

  auto const& all_install_exports =
    this->GetGlobalGenerator()->GetExportSets();
  for (auto const& exp : all_install_exports) {
    // Ignore exports sets which are not for this target.
    auto const& targets = exp.second.GetTargetExports();
    auto tgt_export =
      std::find_if(targets.begin(), targets.end(),
                   [this](std::unique_ptr<cmTargetExport> const& te) {
                     return te->Target == this->GeneratorTarget;
                   });
    if (tgt_export == targets.end()) {
      continue;
    }

    auto const* installs = exp.second.GetInstallations();
    for (auto const* install : *installs) {
      Json::Value tdi_export_info = Json::objectValue;

      auto const& ns = install->GetNamespace();
      auto const& dest = install->GetDestination();
      auto const& cxxm_dir = install->GetCxxModuleDirectory();
      auto const& export_prefix = install->GetTempDir();

      tdi_export_info["namespace"] = ns;
      tdi_export_info["export-name"] = export_name;
      tdi_export_info["destination"] = dest;
      tdi_export_info["cxx-module-info-dir"] = cxxm_dir;
      tdi_export_info["export-prefix"] = export_prefix;
      tdi_export_info["install"] = true;

      tdi_exports.append(tdi_export_info);
    }
  }

  auto const& all_build_exports =
    this->GetMakefile()->GetExportBuildFileGenerators();
  for (auto const& exp : all_build_exports) {
    std::vector<std::string> targets;
    exp->GetTargets(targets);

    // Ignore exports sets which are not for this target.
    auto const& name = this->GeneratorTarget->GetName();
    bool has_current_target =
      std::any_of(targets.begin(), targets.end(),
                  [name](std::string const& tname) { return tname == name; });
    if (!has_current_target) {
      continue;
    }

    Json::Value tdi_export_info = Json::objectValue;

    auto const& ns = exp->GetNamespace();
    auto const& main_fn = exp->GetMainExportFileName();
    auto const& cxxm_dir = exp->GetCxxModuleDirectory();
    auto dest = cmsys::SystemTools::GetParentDirectory(main_fn);
    auto const& export_prefix =
      cmSystemTools::GetFilenamePath(exp->GetMainExportFileName());

    tdi_export_info["namespace"] = ns;
    tdi_export_info["export-name"] = export_name;
    tdi_export_info["destination"] = dest;
    tdi_export_info["cxx-module-info-dir"] = cxxm_dir;
    tdi_export_info["export-prefix"] = export_prefix;
    tdi_export_info["install"] = false;

    tdi_exports.append(tdi_export_info);
  }

  std::string const tdin = this->GetTargetDependInfoPath(lang, config);
  cmGeneratedFileStream tdif(tdin);
  tdif << tdi;
}